

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

void __thiscall File::~File(File *this)

{
  if (this->hasParser == true) {
    ts_tree_delete(this->tree);
    ts_parser_delete(this->parser);
  }
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::~wstring_convert(&(this->utf).converter);
  TextBuffer::~TextBuffer(&this->buffer);
  std::__cxx11::string::~string((string *)&this->languageId);
  Uri::Uri::~Uri(&this->uri);
  return;
}

Assistant:

File::~File () {
    if (hasParser) {
        ts_tree_delete(tree);
        ts_parser_delete(parser);
    }
}